

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpconv.cpp
# Opt level: O0

int grisu2(double d,char *digits,int *K)

{
  int iVar1;
  int *K_00;
  Fp *in_RSI;
  Fp *in_RDI;
  Fp *in_XMM0_Qa;
  Fp FVar2;
  Fp cp;
  int k;
  Fp upper;
  Fp lower;
  Fp w;
  double in_stack_ffffffffffffff70;
  undefined4 uStack_84;
  undefined4 uStack_74;
  undefined4 uStack_64;
  Fp local_60;
  int local_4c;
  Fp local_48;
  Fp local_38;
  char *digits_00;
  
  build_fp(in_stack_ffffffffffffff70);
  get_normalized_boundaries((Fp *)&stack0xffffffffffffffd8,&local_38,&local_48);
  normalize((Fp *)&stack0xffffffffffffffd8);
  FVar2 = find_cachedpow10(local_48.exp,&local_4c);
  local_60.frac = FVar2.frac;
  local_60.exp = FVar2.exp;
  FVar2 = multiply((Fp *)&stack0xffffffffffffffd8,&local_60);
  K_00 = (int *)FVar2.frac;
  digits_00 = (char *)CONCAT44(uStack_64,FVar2.exp);
  FVar2 = multiply(&local_48,&local_60);
  local_48.frac = FVar2.frac;
  local_48._12_4_ = uStack_74;
  local_48.exp = FVar2.exp;
  FVar2 = multiply(&local_38,&local_60);
  local_38._12_4_ = uStack_84;
  local_38.exp = FVar2.exp;
  local_38.frac = FVar2.frac + 1;
  local_48.frac = local_48.frac - 1;
  *(int *)&in_RSI->frac = -local_4c;
  iVar1 = generate_digits(in_XMM0_Qa,in_RDI,in_RSI,digits_00,K_00);
  return iVar1;
}

Assistant:

static int grisu2(double d, char* digits, int* K) {
  Fp w = build_fp(d);

  Fp lower, upper;
  get_normalized_boundaries(&w, &lower, &upper);

  normalize(&w);

  int k;
  Fp cp = find_cachedpow10(upper.exp, &k);

  w = multiply(&w, &cp);
  upper = multiply(&upper, &cp);
  lower = multiply(&lower, &cp);

  lower.frac++;
  upper.frac--;

  *K = -k;

  return generate_digits(&w, &upper, &lower, digits, K);
}